

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O2

int __thiscall
CVmObjTads::getp_set_method(CVmObjTads *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  undefined4 uVar1;
  vm_prop_id_t vVar2;
  int iVar3;
  uint uVar4;
  vm_val_t mval;
  
  if (getp_set_method(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar3 = __cxa_guard_acquire(&getp_set_method(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar3 != 0) {
      getp_set_method::desc.min_argc_ = 2;
      getp_set_method::desc.opt_argc_ = 0;
      getp_set_method::desc.varargs_ = 0;
      __cxa_guard_release(&getp_set_method(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,argc,&getp_set_method::desc);
  if (iVar3 == 0) {
    vVar2 = CVmBif::pop_propid_val();
    mval.typ = sp_[-1].typ;
    mval._4_4_ = *(undefined4 *)&sp_[-1].field_0x4;
    mval.val = sp_[-1].val;
    if (mval.typ == VM_OBJ) {
      uVar1 = mval.val.obj;
      iVar3 = CVmObjString::is_string_obj(mval.val.obj);
      if (iVar3 == 0) {
        uVar4 = uVar1 & 0xfff;
        iVar3 = (**(code **)(*(long *)&G_obj_table_X.pages_[(uint)uVar1 >> 0xc][uVar4].ptr_ + 0x70))
                          (G_obj_table_X.pages_[(uint)uVar1 >> 0xc] + uVar4,0);
        if (iVar3 == 0) {
LAB_002794db:
          err_throw(0x900);
        }
      }
      mval.typ = VM_OBJX;
    }
    else if (mval.typ == VM_SSTRING) {
      mval.typ = VM_DSTRING;
    }
    else if (mval.typ == VM_BIFPTR) {
      mval.typ = VM_BIFPTRX;
    }
    else {
      if (mval.typ != VM_FUNCPTR) goto LAB_002794db;
      mval.typ = VM_CODEOFS;
    }
    (*(this->super_CVmObject)._vptr_CVmObject[0xc])(this,G_undo_X,self,(ulong)vVar2,&mval);
    sp_ = sp_ + -1;
    retval->typ = VM_NIL;
  }
  return 1;
}

Assistant:

int CVmObjTads::getp_set_method(VMG_ vm_obj_id_t self,
                                vm_val_t *retval, uint *argc)
{
    /* check arguments: setMethod(&propid, val) */
    static CVmNativeCodeDesc desc(2);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* 
     *   retrieve the property ID and the method value to set (leave the
     *   value on the stack as gc protection) 
     */
    vm_prop_id_t prop = CVmBif::pop_propid_val(vmg0_);
    vm_val_t mval = *G_stk->get(0);

    /* check the type */
    switch (mval.typ)
    {
    case VM_FUNCPTR:
        /* 
         *   a function pointer translates directly to a regular method, by
         *   directly calling the code body 
         */
        mval.typ = VM_CODEOFS;
        break;

    case VM_OBJ:
        /*
         *   We can accept string and invokable objects.  For either one of
         *   these, we store the object reference and mark it as an
         *   execute-on-eval object rather than an ordinary object value.  
         */
        if (CVmObjString::is_string_obj(vmg_ mval.val.obj)
            || vm_objp(vmg_ mval.val.obj)->get_invoker(vmg_ 0))
        {
            /* 
             *   We can handle this object by executing it on evaluation.
             *   Mark it as a special execute-on-eval object rather than an
             *   ordinary object. 
             */
            mval.typ = VM_OBJX;
        }
        else
        {
            /* it's not an acceptable type of object */
            err_throw(VMERR_BAD_TYPE_BIF);
        }
        break;

    case VM_BIFPTR:
        /* built-in function pointer - mark it as an execute-on-eval bif */
        mval.typ = VM_BIFPTRX;
        break;

    case VM_SSTRING:
        /* 
         *   A constant string translates into a self-printing string.
         *   SSTRING and DSTRING have the same data representation, so we
         *   merely need to switch the type to flag it as print-on-eval. 
         */
        mval.typ = VM_DSTRING;
        break;

    default:
        /* other types are not acceptable */
        err_throw(VMERR_BAD_TYPE_BIF);
    }